

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool ON_SubDLimitMeshSealEdgeInfo::Seal
               (ON_SubDLimitMeshSealEdgeInfo *src,ON_SubDLimitMeshSealEdgeInfo *dst)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  bool bVar5;
  uint local_4c;
  uint local_48;
  uint j1;
  uint j0;
  bool bSameDirection;
  uint uStack_30;
  uchar src_dir;
  uint i1;
  uint i0;
  uint dst_side_segment_count;
  uint src_side_segment_count;
  uchar dst_half;
  uchar src_half;
  bool bSealNormals;
  ON_SubDLimitMeshSealEdgeInfo *dst_local;
  ON_SubDLimitMeshSealEdgeInfo *src_local;
  
  if ((src->m_edge_id == dst->m_edge_id) && (src->m_edge_id != 0)) {
    if ((src->m_fragment == (ON_SubDMeshFragment *)0x0) ||
       (dst->m_fragment == (ON_SubDMeshFragment *)0x0)) {
      src_local._7_1_ = false;
    }
    else {
      bVar1 = src->m_bits & 0xc0;
      bVar2 = dst->m_bits & 0xc0;
      uVar4 = (uint)(src->m_fragment->m_grid).m_side_segment_count;
      local_4c = (uint)(dst->m_fragment->m_grid).m_side_segment_count;
      uStack_30 = src->m_grid_side_dex * uVar4;
      j0 = uStack_30 + uVar4;
      bVar3 = src->m_bits & 1;
      if ((bVar1 != bVar2) || (uVar4 != local_4c)) {
        if ((bVar1 != 0) ||
           (((src->m_face_edge_count != 4 || (dst->m_face_edge_count == 4)) ||
            (local_4c << 1 != uVar4)))) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0xd03,"","unexpected sealing fragment portions");
          return false;
        }
        if (bVar2 == 0x40) {
          if (bVar3 == 0) {
            j0 = j0 - local_4c;
          }
          else {
            uStack_30 = local_4c + uStack_30;
          }
        }
        else {
          if (bVar2 != 0x80) {
            ON_SubDIncrementErrorCount();
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                       ,0xcfa,"","unexpected dst_half");
            return false;
          }
          if (bVar3 == 0) {
            uStack_30 = local_4c + uStack_30;
          }
          else {
            j0 = j0 - local_4c;
          }
        }
      }
      bVar5 = bVar3 != (dst->m_bits & 1);
      local_48 = local_4c;
      if (!bVar5) {
        local_48 = 0;
      }
      local_48 = dst->m_grid_side_dex * local_4c + local_48;
      if (bVar5) {
        local_4c = -local_4c;
      }
      local_4c = local_48 + local_4c;
      ON_SubDMeshFragment::SealAdjacentSides
                (true,(src->m_bits & 2) != 0,src->m_fragment,uStack_30,j0,dst->m_fragment,local_48,
                 local_4c);
      src_local._7_1_ = true;
    }
  }
  else {
    src_local._7_1_ = false;
  }
  return src_local._7_1_;
}

Assistant:

bool ON_SubDLimitMeshSealEdgeInfo::Seal(
  const ON_SubDLimitMeshSealEdgeInfo& src,
  const ON_SubDLimitMeshSealEdgeInfo& dst
)
{
  if (src.m_edge_id != dst.m_edge_id || 0 == src.m_edge_id)
    return false;
  if (nullptr == src.m_fragment || nullptr == dst.m_fragment)
    return false;
  const bool bSealNormals = (0 != (src.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::Smooth));
  const unsigned char src_half = (src.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::HalfMask);
  const unsigned char dst_half = (dst.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::HalfMask);
  unsigned int src_side_segment_count = src.m_fragment->m_grid.m_side_segment_count;
  unsigned int dst_side_segment_count = dst.m_fragment->m_grid.m_side_segment_count;
  unsigned int i0 = src.m_grid_side_dex*src_side_segment_count;
  unsigned int i1 = i0 + src_side_segment_count;

  ////unsigned int vid[2] = {};
  ////const ON_SubDEdge* e = src.m_fragment->Edge(src.m_grid_side_dex);
  ////if (nullptr != e )
  ////{
  ////  const ON_SubDVertex* v = src.m_fragment->Vertex(src.m_grid_side_dex);
  ////  if ( nullptr != v )
  ////    vid[0] = v->m_id;
  ////  v = src.m_fragment->Vertex((src.m_grid_side_dex+1)%4);
  ////  if ( nullptr !=v )
  ////    vid[1] = v->m_id;
  ////}

  // src_dir = 0 if SubD edge and fragment side have compatible natural orientations
  const unsigned char src_dir = (src.m_bits&ON_SubDLimitMeshSealEdgeInfo::Bits::EdgeDir);

  if (src_half != dst_half || src_side_segment_count != dst_side_segment_count)
  {
    if (
      0 == src_half
      && 4 == src.m_face_edge_count
      && 4 != dst.m_face_edge_count
      && 2 * dst_side_segment_count == src_side_segment_count)
    {
      // The face for src_half is a quad and the face for dest_half is an N-gon with N != 3,
      // and src_fragment is a full sized fragment and dst_fragment is a half sized fragment.
      if (ON_SubDLimitMeshSealEdgeInfo::Bits::FirstHalf == dst_half)
      {
        // only copy half of src_fragment side
        if (0 == src_dir)
        {
          i1 -= dst_side_segment_count; // copy first half of src_fragment side
          ////vid[1] = 0;
        }
        else
        {
          i0 += dst_side_segment_count; // copy 2nd half of src_fragment side
          ////vid[0] = 0;
        }
      }
      else if (ON_SubDLimitMeshSealEdgeInfo::Bits::SecondHalf == dst_half)
      {
        // only copy half of src_fragment side
        if (0 == src_dir)
        {
          i0 += dst_side_segment_count; // copy 2nd half of src_fragment side
          ////vid[0] = 0;
        }
        else
        {
          i1 -= dst_side_segment_count; // copy first half of src_fragment side
          ////vid[1] = 0;
        }
      }
      else
      {
        // bug in this code or the code that sets the m_bits information.
        ON_SUBD_ERROR("unexpected dst_half");
        return false;
      }
    }
    else
    {
      // Either the parent subd is invalid or information
      // set in the fragments, or the sorting in ON_SubDMeshImpl::SealEdges()
      // is not valid (or some other bug).
      ON_SUBD_ERROR("unexpected sealing fragment portions");
      return false;
    }
  }

  // seal this edge
  const bool bSameDirection = (src_dir == (dst.m_bits&ON_SubDLimitMeshSealEdgeInfo::Bits::EdgeDir));
  const unsigned int j0 = dst.m_grid_side_dex*dst_side_segment_count + (bSameDirection?0:dst_side_segment_count);
  const unsigned int j1 = bSameDirection ? (j0+dst_side_segment_count) : (j0-dst_side_segment_count);
  ON_SubDMeshFragment::SealAdjacentSides(
    true, // bTestNearEqual,
    bSealNormals,
    *src.m_fragment,
    i0,
    i1,
    *dst.m_fragment,
    j0,
    j1
  );
  return true;
}